

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::DatePart::
PropagateDatePartStatistics<duckdb::dtime_t,duckdb::DatePart::EpochMicrosecondsOperator,long>
          (vector<duckdb::BaseStatistics,_true> *child_stats,LogicalType *stats_type)

{
  bool bVar1;
  ulong uVar2;
  LogicalType *in_RDX;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> in_RDI;
  BaseStatistics result;
  long max_part;
  long min_part;
  dtime_t max;
  dtime_t min;
  value_type *nstats;
  nullptr_t in_stack_fffffffffffffe78;
  vector<duckdb::BaseStatistics,_true> *in_stack_fffffffffffffe80;
  Value local_160 [56];
  BaseStatistics *in_stack_fffffffffffffed8;
  Value local_120 [80];
  LogicalType local_d0 [24];
  BaseStatistics local_b8 [88];
  int64_t local_60;
  int64_t local_58;
  int64_t local_50;
  int64_t local_48;
  int64_t local_40;
  int64_t local_38;
  dtime_t local_30;
  dtime_t local_28;
  reference local_20;
  LogicalType *local_18;
  
  local_18 = in_RDX;
  local_20 = vector<duckdb::BaseStatistics,_true>::operator[]
                       (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
  uVar2 = duckdb::NumericStats::HasMinMax(local_20);
  if ((uVar2 & 1) == 0) {
    unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
    unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
              ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  }
  else {
    local_28 = NumericStats::GetMin<duckdb::dtime_t>(in_stack_fffffffffffffed8);
    local_30 = NumericStats::GetMax<duckdb::dtime_t>(in_stack_fffffffffffffed8);
    bVar1 = dtime_t::operator>(&local_28,&local_30);
    if (bVar1) {
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    else {
      local_38 = local_28.micros;
      bVar1 = Value::IsFinite<duckdb::dtime_t>(local_28);
      if (bVar1) {
        local_40 = local_30.micros;
        bVar1 = Value::IsFinite<duckdb::dtime_t>(local_30);
        if (bVar1) {
          local_50 = local_28.micros;
          local_48 = EpochMicrosecondsOperator::Operation<duckdb::dtime_t,long>(local_28);
          local_60 = local_30.micros;
          local_58 = EpochMicrosecondsOperator::Operation<duckdb::dtime_t,long>(local_30);
          duckdb::LogicalType::LogicalType(local_d0,local_18);
          duckdb::NumericStats::CreateEmpty(local_b8,local_d0);
          duckdb::LogicalType::~LogicalType(local_d0);
          duckdb::Value::Value(local_120,local_48);
          duckdb::NumericStats::SetMin(local_b8,local_120);
          duckdb::Value::~Value(local_120);
          duckdb::Value::Value(local_160,local_58);
          duckdb::NumericStats::SetMax(local_b8,local_160);
          duckdb::Value::~Value(local_160);
          vector<duckdb::BaseStatistics,_true>::operator[]
                    (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
          duckdb::BaseStatistics::CopyValidity(local_b8);
          duckdb::BaseStatistics::ToUnique();
          duckdb::BaseStatistics::~BaseStatistics(local_b8);
          return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
                 (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                  )in_RDI._M_t.
                   super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                   .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
        }
      }
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDatePartStatistics(vector<BaseStatistics> &child_stats,
	                                                              const LogicalType &stats_type = LogicalType::BIGINT) {
		// we can only propagate complex date part stats if the child has stats
		auto &nstats = child_stats[0];
		if (!NumericStats::HasMinMax(nstats)) {
			return nullptr;
		}
		// run the operator on both the min and the max, this gives us the [min, max] bound
		auto min = NumericStats::GetMin<T>(nstats);
		auto max = NumericStats::GetMax<T>(nstats);
		if (min > max) {
			return nullptr;
		}
		// Infinities prevent us from computing generic ranges
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			return nullptr;
		}
		TR min_part = OP::template Operation<T, TR>(min);
		TR max_part = OP::template Operation<T, TR>(max);
		auto result = NumericStats::CreateEmpty(stats_type);
		NumericStats::SetMin(result, Value(min_part));
		NumericStats::SetMax(result, Value(max_part));
		result.CopyValidity(child_stats[0]);
		return result.ToUnique();
	}